

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)1>(SerialArena *this,size_t n)

{
  bool bVar1;
  type tVar2;
  char **v1;
  char **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  SerialArena *local_a8;
  void *ptr;
  void *res;
  Voidify local_81;
  char *local_80;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_68;
  Voidify local_51;
  size_t local_50;
  size_t n_local;
  SerialArena *this_local;
  SerialArena *local_38;
  void *ret;
  CachedBlock **cached_head;
  size_t index;
  SerialArena *local_18;
  SerialArena *local_10;
  
  local_50 = n;
  n_local = (size_t)this;
  bVar1 = ArenaAlignDefault::IsAligned(n);
  absl_log_internal_check_op_result._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
               ,0x75,"internal::ArenaAlignDefault::IsAligned(n)");
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar3);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&this->limit_);
  local_80 = SerialArena::ptr(this);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_80);
  local_78 = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>(v1,v2,"limit_ >= ptr()");
  if (local_78 == (Nullable<const_char_*>)0x0) {
    index = local_50;
    local_18 = this;
    if (local_50 < 0x10) {
      local_10 = (SerialArena *)0x0;
    }
    else {
      tVar2 = absl::lts_20250127::bit_width<unsigned_long>(local_50 - 1);
      cached_head = (CachedBlock **)(long)(tVar2 + -4);
      if (cached_head < (CachedBlock **)(ulong)this->cached_block_length_) {
        ret = this->cached_blocks_ + (long)cached_head;
        if (*ret == (CachedBlock *)0x0) {
          local_10 = (SerialArena *)0x0;
        }
        else {
          local_38 = *ret;
          UnpoisonMemoryRegion(local_38,index);
          *(undefined8 *)ret = **ret;
          local_10 = local_38;
        }
      }
      else {
        local_10 = (SerialArena *)0x0;
      }
    }
    ptr = local_10;
    if (local_10 == (SerialArena *)0x0) {
      bVar1 = MaybeAllocateAligned(this,local_50,&local_a8);
      if (bVar1) {
        this_local = local_a8;
      }
      else {
        this_local = (SerialArena *)AllocateAlignedFallback(this,local_50);
      }
    }
    else {
      this_local = local_10;
    }
    return this_local;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_78);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&res,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,0x76,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&res);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&res);
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }